

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O1

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  long *local_50 [2];
  long local_40 [2];
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Compare).Type = 0;
  (this->Compare).Value._M_dataplus._M_p = (pointer)&(this->Compare).Value.field_2;
  (this->Compare).Value._M_string_length = 0;
  (this->Compare).Value.field_2._M_local_buf[0] = '\0';
  lVar2 = std::__cxx11::string::find((char *)dependence,0x4db0f6,0);
  cVar4 = (char)dependence;
  if (lVar2 == -1) {
    lVar2 = std::__cxx11::string::find((char *)dependence,0x4db0f9,0);
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find(cVar4,0x3c);
      if (lVar2 == -1) {
        lVar2 = std::__cxx11::string::find(cVar4,0x3d);
        if (lVar2 == -1) {
          lVar2 = std::__cxx11::string::find(cVar4,0x3e);
          if (lVar2 == -1) {
            lVar2 = std::__cxx11::string::find(cVar4,0x2d);
            if (lVar2 == -1) {
              lVar2 = -1;
              goto LAB_0016ee3d;
            }
            (this->Compare).Type = 0;
            std::__cxx11::string::substr((ulong)local_50,(ulong)dependence);
          }
          else {
            (this->Compare).Type = 4;
            std::__cxx11::string::substr((ulong)local_50,(ulong)dependence);
          }
        }
        else {
          (this->Compare).Type = 1;
          std::__cxx11::string::substr((ulong)local_50,(ulong)dependence);
        }
      }
      else {
        (this->Compare).Type = 2;
        std::__cxx11::string::substr((ulong)local_50,(ulong)dependence);
      }
    }
    else {
      (this->Compare).Type = 5;
      std::__cxx11::string::substr((ulong)local_50,(ulong)dependence);
    }
  }
  else {
    (this->Compare).Type = 3;
    std::__cxx11::string::substr((ulong)local_50,(ulong)dependence);
  }
  std::__cxx11::string::operator=((string *)&(this->Compare).Value,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
LAB_0016ee3d:
  lVar3 = std::__cxx11::string::find(cVar4,0x2d);
  if (lVar3 != -1) {
    lVar2 = lVar3;
  }
  if (lVar2 == -1) {
    local_50[0] = local_40;
    pcVar1 = (dependence->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + dependence->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)dependence);
  }
  std::__cxx11::string::_M_assign((string *)this);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string& dependence)
{
  // Search compare section
  size_t pos = std::string::npos;
  if ((pos = dependence.find("<=")) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareLessOrEqual;
    this->Compare.Value = dependence.substr(pos + 2);
  } else if ((pos = dependence.find(">=")) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareGreaterOrEqual;
    this->Compare.Value = dependence.substr(pos + 2);
  } else if ((pos = dependence.find('<')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareLess;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('=')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareEqual;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('>')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareGreater;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('-')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareNone;
    this->Compare.Value = dependence.substr(pos + 1);
  }
  size_t dashPos = dependence.find('-');
  if (dashPos != std::string::npos) {
    pos = dashPos;
  }
  this->Name =
    pos == std::string::npos ? dependence : dependence.substr(0, pos);
}